

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_thread_exdata(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  
  if (*J->base != 0) {
    recff_nyi(J,rd);
    return;
  }
  (J->fold).ins.field_0.ot = 0x4106;
  (J->fold).ins.field_1.op12 = 0;
  TVar1 = lj_opt_fold(J);
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090005;
  TVar1 = lj_opt_fold(J);
  TVar2 = lj_ir_kint(J,0x11);
  (J->fold).ins.field_0.ot = 0x548a;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
  TVar1 = lj_opt_fold(J);
  *J->base = TVar1;
  return;
}

Assistant:

void LJ_FASTCALL recff_thread_exdata(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (!tr) {
    TRef trl = emitir(IRT(IR_LREF, IRT_THREAD), 0, 0);
    TRef trp = emitir(IRT(IR_FLOAD, IRT_PTR), trl, IRFL_THREAD_EXDATA);
    TRef trid = lj_ir_kint(J, CTID_P_VOID);
    J->base[0] = emitir(IRTG(IR_CNEWI, IRT_CDATA), trid, trp);
    return;
  }
  recff_nyiu(J, rd);  /* this case is too rare to be interesting */
}